

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *ilimit_w;
  seqDef **ppsVar1;
  long *iEnd;
  long *iStart;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ZSTD_longLengthType_e ZVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  BYTE *pBVar12;
  int *op;
  uint uVar13;
  int iVar14;
  undefined8 uVar15;
  bool bVar16;
  char cVar17;
  uint uVar18;
  long *plVar19;
  size_t sVar20;
  long *plVar21;
  seqDef *psVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  U32 UVar26;
  long *plVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long *plVar33;
  int iVar34;
  ulong uVar35;
  BYTE *pBVar36;
  BYTE *pBVar37;
  ulong uVar38;
  U32 UVar39;
  BYTE *pBVar40;
  U32 UVar41;
  U32 UVar42;
  BYTE *litEnd;
  long *plVar43;
  int iVar44;
  BYTE *litLimit_w;
  long *local_148;
  
  iEnd = (long *)((long)src + srcSize);
  pBVar9 = (ms->window).base;
  iVar44 = (int)pBVar9;
  iVar34 = (int)iEnd - iVar44;
  uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar5 = (ms->window).lowLimit;
  uVar13 = iVar34 - uVar18;
  if (iVar34 - uVar5 <= uVar18) {
    uVar13 = uVar5;
  }
  if (ms->loadedDictEnd != 0) {
    uVar13 = uVar5;
  }
  uVar5 = (ms->window).dictLimit;
  uVar38 = (ulong)uVar5;
  if (uVar5 <= uVar13) {
    sVar20 = ZSTD_compressBlock_doubleFast(ms,seqStore,rep,src,srcSize);
    return sVar20;
  }
  plVar19 = (long *)((long)src + (srcSize - 8));
  UVar39 = *rep;
  UVar41 = rep[1];
  local_148 = (long *)src;
  if (src < plVar19) {
    uVar18 = (ms->cParams).chainLog;
    if (0x20 < uVar18) {
LAB_007876ba:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    pUVar10 = ms->hashTable;
    uVar6 = (ms->cParams).hashLog;
    pUVar11 = ms->chainTable;
    pBVar12 = (ms->window).dictBase;
    cVar17 = (char)uVar18;
    bVar23 = 0x40 - cVar17;
    bVar24 = 0x40 - (char)uVar6;
    iStart = (long *)(pBVar9 + uVar38);
    plVar2 = (long *)(pBVar12 + uVar13);
    plVar3 = (long *)(pBVar12 + uVar38);
    ilimit_w = iEnd + -4;
    ppsVar1 = &seqStore->sequences;
    do {
      uVar30 = (ulong)(mls - 5);
      switch(uVar30) {
      case 0:
        lVar31 = -0x30e4432345000000;
        break;
      case 1:
        lVar31 = -0x30e4432340650000;
        break;
      case 2:
        lVar31 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar32 = *src * -0x30e44323485a9b9d;
        goto LAB_0078693b;
      default:
        uVar32 = (ulong)((uint)((int)*src * -0x61c8864f) >> (0x20U - cVar17 & 0x1f));
        goto LAB_00786943;
      }
      uVar32 = lVar31 * *src;
LAB_0078693b:
      uVar32 = uVar32 >> (bVar23 & 0x3f);
LAB_00786943:
      uVar18 = pUVar11[uVar32];
      pBVar37 = pBVar9;
      if (uVar18 < uVar5) {
        pBVar37 = pBVar12;
      }
      if (0x20 < uVar6) goto LAB_007876ba;
      lVar31 = *src;
      uVar35 = (ulong)(lVar31 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f);
      uVar7 = pUVar10[uVar35];
      pBVar40 = pBVar9;
      if (uVar7 < uVar5) {
        pBVar40 = pBVar12;
      }
      UVar42 = (int)src - iVar44;
      UVar26 = UVar42 + 1;
      uVar29 = UVar26 - UVar39;
      pUVar10[uVar35] = UVar42;
      pBVar36 = pBVar9;
      if (uVar29 < uVar5) {
        pBVar36 = pBVar12;
      }
      pUVar11[uVar32] = UVar42;
      if (((UVar26 - uVar13 < UVar39) || ((uVar5 - 1) - uVar29 < 3)) ||
         (*(int *)(pBVar36 + uVar29) != *(int *)((long)src + 1))) {
        plVar43 = (long *)src;
        if ((uVar13 < uVar7) && (plVar27 = (long *)(pBVar40 + uVar7), *plVar27 == lVar31)) {
          plVar33 = iStart;
          plVar21 = iEnd;
          if (uVar7 < uVar5) {
            plVar33 = plVar2;
            plVar21 = plVar3;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 8),(BYTE *)(plVar27 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar21,(BYTE *)iStart);
          uVar32 = sVar20 + 8;
          if ((plVar33 < plVar27) && (local_148 < src)) {
            plVar27 = (long *)(pBVar40 + uVar7);
            do {
              plVar27 = (long *)((long)plVar27 + -1);
              plVar21 = (long *)((long)src + -1);
              plVar43 = (long *)src;
              if ((*(BYTE *)plVar21 != *(BYTE *)plVar27) ||
                 (uVar32 = uVar32 + 1, plVar43 = plVar21, plVar27 <= plVar33)) break;
              src = plVar21;
            } while (local_148 < plVar21);
          }
          UVar26 = UVar42 - uVar7;
          if (UVar26 == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                          ,0x295,
                          "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0078765d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0078763e;
          uVar35 = (long)plVar43 - (long)local_148;
          plVar27 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar27 + uVar35))
          goto LAB_0078767c;
          if (iEnd < plVar43) goto LAB_0078769b;
          if (ilimit_w < plVar43) {
            ZSTD_safecopyLiterals
                      ((BYTE *)plVar27,(BYTE *)local_148,(BYTE *)plVar43,(BYTE *)ilimit_w);
          }
          else {
            lVar31 = local_148[1];
            *plVar27 = *local_148;
            plVar27[1] = lVar31;
            if (0x10 < uVar35) {
              pBVar37 = seqStore->lit;
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar37 + 0x10) + (-0x10 - (long)(local_148 + 2))))
              goto LAB_00787736;
              lVar31 = local_148[3];
              *(long *)(pBVar37 + 0x10) = local_148[2];
              *(long *)(pBVar37 + 0x18) = lVar31;
              if (0x20 < (long)uVar35) {
                lVar31 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_148 + lVar31 + 0x20);
                  uVar15 = puVar4[1];
                  pBVar40 = pBVar37 + lVar31 + 0x20;
                  *(undefined8 *)pBVar40 = *puVar4;
                  *(undefined8 *)(pBVar40 + 8) = uVar15;
                  puVar4 = (undefined8 *)((long)local_148 + lVar31 + 0x30);
                  uVar15 = puVar4[1];
                  *(undefined8 *)(pBVar40 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar40 + 0x18) = uVar15;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar40 + 0x20 < pBVar37 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007876f8;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar22 = *ppsVar1;
          psVar22->litLength = (U16)uVar35;
          psVar22->offBase = UVar26 + 3;
          if (uVar32 < 3) goto LAB_0078761f;
          uVar35 = uVar32 - 3;
          UVar41 = UVar39;
          if (0xffff < uVar35) {
            ZVar8 = seqStore->longLengthType;
            UVar39 = UVar26;
            goto joined_r0x007871b5;
          }
          goto LAB_007871d8;
        }
        if ((uVar13 < uVar18) && (plVar27 = (long *)(pBVar37 + uVar18), (int)*plVar27 == (int)*src))
        {
          lVar31 = *(long *)((long)src + 1);
          uVar32 = (ulong)(lVar31 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f);
          uVar7 = pUVar10[uVar32];
          pBVar40 = pBVar9;
          if (uVar7 < uVar5) {
            pBVar40 = pBVar12;
          }
          pUVar10[uVar32] = UVar26;
          if ((uVar13 < uVar7) && (plVar21 = (long *)(pBVar40 + uVar7), *plVar21 == lVar31)) {
            plVar43 = (long *)((long)src + 1);
            plVar33 = iStart;
            plVar27 = iEnd;
            if (uVar7 < uVar5) {
              plVar33 = plVar2;
              plVar27 = plVar3;
            }
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 9),(BYTE *)(plVar21 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar27,(BYTE *)iStart);
            uVar32 = sVar20 + 8;
            UVar26 = UVar26 - uVar7;
            if ((plVar33 < plVar21) && (local_148 < plVar43)) {
              plVar27 = (long *)(pBVar40 + uVar7);
              while (plVar43 = (long *)src, plVar27 = (long *)((long)plVar27 + -1),
                    (BYTE)*plVar43 == *(BYTE *)plVar27) {
                uVar32 = uVar32 + 1;
                if ((plVar27 <= plVar33) ||
                   (src = (long *)((long)plVar43 + -1), plVar43 <= local_148)) goto LAB_0078705c;
              }
              plVar43 = (long *)((long)plVar43 + 1);
            }
          }
          else {
            plVar33 = iStart;
            plVar21 = iEnd;
            if (uVar18 < uVar5) {
              plVar33 = plVar2;
              plVar21 = plVar3;
            }
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)plVar27 + 4),(BYTE *)iEnd,
                                (BYTE *)plVar21,(BYTE *)iStart);
            uVar32 = sVar20 + 4;
            UVar26 = UVar42 - uVar18;
            if ((plVar33 < plVar27) && (local_148 < src)) {
              plVar27 = (long *)(pBVar37 + uVar18);
              do {
                plVar27 = (long *)((long)plVar27 + -1);
                plVar21 = (long *)((long)plVar43 + -1);
                if ((*(BYTE *)plVar21 != *(BYTE *)plVar27) ||
                   (uVar32 = uVar32 + 1, plVar43 = plVar21, plVar27 <= plVar33)) break;
              } while (local_148 < plVar21);
            }
          }
LAB_0078705c:
          if (UVar26 == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                          ,0x2ae,
                          "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0078765d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0078763e;
          uVar35 = (long)plVar43 - (long)local_148;
          plVar27 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar27 + uVar35))
          goto LAB_0078767c;
          if (iEnd < plVar43) goto LAB_0078769b;
          if (ilimit_w < plVar43) {
            ZSTD_safecopyLiterals
                      ((BYTE *)plVar27,(BYTE *)local_148,(BYTE *)plVar43,(BYTE *)ilimit_w);
          }
          else {
            lVar31 = local_148[1];
            *plVar27 = *local_148;
            plVar27[1] = lVar31;
            if (0x10 < uVar35) {
              pBVar37 = seqStore->lit;
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar37 + 0x10) + (-0x10 - (long)(local_148 + 2))))
              goto LAB_00787736;
              lVar31 = local_148[3];
              *(long *)(pBVar37 + 0x10) = local_148[2];
              *(long *)(pBVar37 + 0x18) = lVar31;
              if (0x20 < (long)uVar35) {
                lVar31 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_148 + lVar31 + 0x20);
                  uVar15 = puVar4[1];
                  pBVar40 = pBVar37 + lVar31 + 0x20;
                  *(undefined8 *)pBVar40 = *puVar4;
                  *(undefined8 *)(pBVar40 + 8) = uVar15;
                  puVar4 = (undefined8 *)((long)local_148 + lVar31 + 0x30);
                  uVar15 = puVar4[1];
                  *(undefined8 *)(pBVar40 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar40 + 0x18) = uVar15;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar40 + 0x20 < pBVar37 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007876f8;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar22 = *ppsVar1;
          psVar22->litLength = (U16)uVar35;
          psVar22->offBase = UVar26 + 3;
          if (uVar32 < 3) goto LAB_0078761f;
          uVar35 = uVar32 - 3;
          UVar41 = UVar39;
          if (0xffff < uVar35) {
            ZVar8 = seqStore->longLengthType;
            UVar39 = UVar26;
            goto joined_r0x007871b5;
          }
          goto LAB_007871d8;
        }
        src = (void *)((long)src + ((long)src - (long)local_148 >> 8) + 1);
        goto LAB_007875ba;
      }
      plVar43 = iEnd;
      if (uVar29 < uVar5) {
        plVar43 = plVar3;
      }
      sVar20 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 5),(BYTE *)((long)(pBVar36 + uVar29) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar43,(BYTE *)iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0078765d:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
LAB_0078763e:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      plVar43 = (long *)((long)src + 1);
      uVar35 = (long)plVar43 - (long)local_148;
      plVar27 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar27 + uVar35)) {
LAB_0078767c:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < plVar43) {
LAB_0078769b:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit_w < plVar43) {
        ZSTD_safecopyLiterals((BYTE *)plVar27,(BYTE *)local_148,(BYTE *)plVar43,(BYTE *)ilimit_w);
      }
      else {
        lVar31 = local_148[1];
        *plVar27 = *local_148;
        plVar27[1] = lVar31;
        if (0x10 < uVar35) {
          pBVar37 = seqStore->lit;
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar37 + 0x10) + (-0x10 - (long)(local_148 + 2)))
             ) {
LAB_00787736:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          lVar31 = local_148[3];
          *(long *)(pBVar37 + 0x10) = local_148[2];
          *(long *)(pBVar37 + 0x18) = lVar31;
          if (0x20 < (long)uVar35) {
            lVar31 = 0;
            do {
              puVar4 = (undefined8 *)((long)local_148 + lVar31 + 0x20);
              uVar15 = puVar4[1];
              pBVar40 = pBVar37 + lVar31 + 0x20;
              *(undefined8 *)pBVar40 = *puVar4;
              *(undefined8 *)(pBVar40 + 8) = uVar15;
              puVar4 = (undefined8 *)((long)local_148 + lVar31 + 0x30);
              uVar15 = puVar4[1];
              *(undefined8 *)(pBVar40 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar40 + 0x18) = uVar15;
              lVar31 = lVar31 + 0x20;
            } while (pBVar40 + 0x20 < pBVar37 + uVar35);
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar35;
      if (0xffff < uVar35) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_007876f8:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      uVar32 = sVar20 + 4;
      psVar22 = *ppsVar1;
      psVar22->litLength = (U16)uVar35;
      psVar22->offBase = 1;
      if (uVar32 < 3) {
LAB_0078761f:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar35 = sVar20 + 1;
      UVar26 = UVar39;
      if (0xffff < uVar35) {
        ZVar8 = seqStore->longLengthType;
joined_r0x007871b5:
        if (ZVar8 != ZSTD_llt_none) {
LAB_007876d9:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
        UVar26 = UVar39;
      }
LAB_007871d8:
      UVar39 = UVar26;
      src = (void *)(uVar32 + (long)plVar43);
      psVar22->mlBase = (U16)uVar35;
      *ppsVar1 = psVar22 + 1;
      local_148 = (long *)src;
      if (plVar19 < src) goto LAB_007875ba;
      uVar18 = UVar42 + 2;
      lVar31 = *(long *)(pBVar9 + uVar18);
      uVar32 = lVar31 * -0x30e44323485a9b9d;
      pUVar10[uVar32 >> (bVar24 & 0x3f)] = uVar18;
      pUVar10[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)] =
           ((int)src + -2) - iVar44;
      switch(uVar30) {
      case 0:
        lVar28 = -0x30e4432345000000;
        break;
      case 1:
        lVar28 = -0x30e4432340650000;
        break;
      case 2:
        lVar28 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar32 = uVar32 >> (bVar23 & 0x3f);
        goto LAB_007872d5;
      default:
        uVar32 = (ulong)((uint)(*(int *)(pBVar9 + uVar18) * -0x61c8864f) >> (0x20U - cVar17 & 0x1f))
        ;
        goto LAB_007872d5;
      }
      uVar32 = (ulong)(lVar31 * lVar28) >> (bVar23 & 0x3f);
LAB_007872d5:
      pUVar11[uVar32] = uVar18;
      plVar43 = (long *)((long)src + -1);
      switch(uVar30) {
      case 0:
        uVar32 = *plVar43 * -0x30e4432345000000;
        bVar25 = bVar23;
        break;
      case 1:
        uVar32 = *plVar43 * -0x30e4432340650000;
        bVar25 = 0x40 - cVar17;
        break;
      case 2:
        uVar32 = *plVar43 * -0x30e44323405a9d00;
        bVar25 = 0x40 - cVar17;
        break;
      case 3:
        uVar32 = *plVar43 * -0x30e44323485a9b9d;
        bVar25 = 0x40 - cVar17;
        break;
      default:
        uVar32 = (ulong)((uint)(*(int *)plVar43 * -0x61c8864f) >> (0x20U - cVar17 & 0x1f));
        goto LAB_00787348;
      }
      uVar32 = uVar32 >> (bVar25 & 0x3f);
LAB_00787348:
      pUVar11[uVar32] = (int)plVar43 - iVar44;
      do {
        if (plVar19 < src) break;
        UVar26 = (int)src - iVar44;
        uVar18 = UVar26 - UVar41;
        pBVar37 = pBVar9;
        if (uVar18 < uVar5) {
          pBVar37 = pBVar12;
        }
        if (((UVar26 - uVar13 < UVar41) || ((uVar5 - 1) - uVar18 < 3)) ||
           (*(int *)(pBVar37 + uVar18) != (int)*src)) {
          bVar16 = false;
          UVar26 = UVar41;
        }
        else {
          plVar43 = iEnd;
          if (uVar18 < uVar5) {
            plVar43 = plVar3;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar37 + uVar18) + 4),
                              (BYTE *)iEnd,(BYTE *)plVar43,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0078765d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0078763e;
          op = (int *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < op) goto LAB_0078767c;
          if (iEnd < local_148) goto LAB_0078769b;
          if (ilimit_w < local_148) {
            ZSTD_safecopyLiterals((BYTE *)op,(BYTE *)local_148,(BYTE *)local_148,(BYTE *)ilimit_w);
          }
          else {
            iVar34 = *(int *)((long)local_148 + 4);
            lVar31 = local_148[1];
            iVar14 = *(int *)((long)local_148 + 0xc);
            *op = (int)*local_148;
            op[1] = iVar34;
            op[2] = (int)lVar31;
            op[3] = iVar14;
          }
          uVar32 = sVar20 + 4;
          psVar22 = seqStore->sequences;
          psVar22->litLength = 0;
          psVar22->offBase = 1;
          if (uVar32 < 3) goto LAB_0078761f;
          uVar35 = uVar32;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007876d9;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            uVar35 = (ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3;
            seqStore->longLengthPos = (U32)uVar35;
          }
          psVar22->mlBase = (U16)(sVar20 + 1);
          seqStore->sequences = psVar22 + 1;
          if (mls - 5 < 4) {
            sVar20 = (*(code *)(&DAT_00938cec + *(int *)(&DAT_00938cec + uVar30 * 4)))
                               (UVar39,uVar35,plVar19,&DAT_00938cec,pBVar12,uVar38);
            return sVar20;
          }
          pUVar11[(uint)((int)*src * -0x61c8864f) >> (0x20U - cVar17 & 0x1f)] = UVar26;
          pUVar10[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)] = UVar26;
          src = (void *)(uVar32 + (long)src);
          bVar16 = true;
          UVar26 = UVar39;
          UVar39 = UVar41;
          local_148 = (long *)src;
        }
        UVar41 = UVar26;
      } while (bVar16);
LAB_007875ba:
    } while (src < plVar19);
  }
  *rep = UVar39;
  rep[1] = UVar41;
  return (long)iEnd - (long)local_148;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast(ms, seqStore, rep, src, srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 <= curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, REPCODE1_TO_OFFBASE, mLength);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 <= current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}